

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::UnfinishedSections::~UnfinishedSections(UnfinishedSections *this)

{
  UnfinishedSections *this_local;
  
  SectionInfo::~SectionInfo(&this->info);
  return;
}

Assistant:

UnfinishedSections( SectionInfo const& _info, Counts const& _prevAssertions, double _durationInSeconds )
            : info( _info ), prevAssertions( _prevAssertions ), durationInSeconds( _durationInSeconds )
            {}